

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_quadrature_mirror_filter_banks.cc
# Opt level: O1

bool __thiscall
sptk::PseudoQuadratureMirrorFilterBanks::Run
          (PseudoQuadratureMirrorFilterBanks *this,double input,
          vector<double,_std::allocator<double>_> *output,Buffer *buffer)

{
  vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
  *this_00;
  bool bVar1;
  Buffer *pBVar2;
  iterator itr;
  pointer ppBVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  bVar5 = false;
  if (((buffer != (Buffer *)0x0) &&
      (bVar5 = false, output != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (this->is_valid_ != false)) {
    if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->num_subband_) {
      std::vector<double,_std::allocator<double>_>::resize(output,(long)this->num_subband_);
    }
    this_00 = &buffer->buffer_for_all_zero_filter_;
    ppBVar3 = (buffer->buffer_for_all_zero_filter_).
              super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(buffer->buffer_for_all_zero_filter_).
              super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar3 >> 3 !=
        (long)this->num_subband_) {
      for (; ppBVar3 !=
             (buffer->buffer_for_all_zero_filter_).
             super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
             ._M_impl.super__Vector_impl_data._M_finish; ppBVar3 = ppBVar3 + 1) {
        if (*ppBVar3 != (Buffer *)0x0) {
          (*(*ppBVar3)->_vptr_Buffer[1])();
        }
        *ppBVar3 = (Buffer *)0x0;
      }
      std::
      vector<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
      ::resize(this_00,(long)this->num_subband_);
      ppBVar3 = (buffer->buffer_for_all_zero_filter_).
                super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppBVar3 !=
          (buffer->buffer_for_all_zero_filter_).
          super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pBVar2 = (Buffer *)operator_new(0x20);
          pBVar2->_vptr_Buffer = (_func_int **)&PTR__Buffer_00113ba8;
          (pBVar2->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pBVar2->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pBVar2->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          *ppBVar3 = pBVar2;
          ppBVar3 = ppBVar3 + 1;
        } while (ppBVar3 !=
                 (buffer->buffer_for_all_zero_filter_).
                 super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    bVar5 = this->num_subband_ < 1;
    if (0 < this->num_subband_) {
      bVar1 = AllZeroDigitalFilter::Run
                        (&this->all_zero_filter_,
                         (this->filter_banks_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,input,
                         (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         *(this_00->
                          super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      if (bVar1) {
        lVar6 = 1;
        lVar7 = 8;
        lVar4 = 0x18;
        do {
          bVar5 = this->num_subband_ <= lVar6;
          if (this->num_subband_ <= lVar6) {
            return bVar5;
          }
          bVar1 = AllZeroDigitalFilter::Run
                            (&this->all_zero_filter_,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&(((this->filter_banks_).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start + lVar4),input,
                             (double *)
                             ((long)(output->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar7),
                             (this_00->
                             super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar6]);
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 8;
          lVar4 = lVar4 + 0x18;
        } while (bVar1);
      }
    }
  }
  return bVar5;
}

Assistant:

bool PseudoQuadratureMirrorFilterBanks::Run(
    double input, std::vector<double>* output,
    PseudoQuadratureMirrorFilterBanks::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || output == nullptr || buffer == nullptr) return false;

  // Prepare memories.
  if (output->size() != static_cast<std::size_t>(num_subband_)) {
    output->resize(num_subband_);
  }
  if (buffer->buffer_for_all_zero_filter_.size() !=
      static_cast<std::size_t>(num_subband_)) {
    for (std::vector<AllZeroDigitalFilter::Buffer*>::iterator itr(
             buffer->buffer_for_all_zero_filter_.begin());
         itr != buffer->buffer_for_all_zero_filter_.end(); ++itr) {
      delete (*itr);
      *itr = NULL;
    }

    buffer->buffer_for_all_zero_filter_.resize(num_subband_);
    for (std::vector<AllZeroDigitalFilter::Buffer*>::iterator itr(
             buffer->buffer_for_all_zero_filter_.begin());
         itr != buffer->buffer_for_all_zero_filter_.end(); ++itr) {
      *itr = new AllZeroDigitalFilter::Buffer();
    }
  }

  for (int k(0); k < num_subband_; ++k) {
    if (!all_zero_filter_.Run(filter_banks_[k], input, &((*output)[k]),
                              buffer->buffer_for_all_zero_filter_[k])) {
      return false;
    }
  }

  return true;
}